

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# payload.hpp
# Opt level: O0

void trackerboy::writePayloadImpl<trackerboy::SongHandler>
               (Module *mod,OutputBlock *block,SongHandler *handler)

{
  BlockId id;
  size_t sVar1;
  undefined8 local_30;
  size_t i;
  size_t count;
  SongHandler *handler_local;
  OutputBlock *block_local;
  Module *mod_local;
  
  sVar1 = PayloadHandler<1196314451U>::count(&handler->super_PayloadHandler<1196314451U>);
  for (local_30 = 0; local_30 < sVar1; local_30 = local_30 + 1) {
    id = PayloadHandler<1196314451U>::id(&handler->super_PayloadHandler<1196314451U>);
    OutputBlock::begin(block,id);
    SongHandler::processOut(handler,mod,block,local_30);
    OutputBlock::finish(block);
  }
  return;
}

Assistant:

void writePayloadImpl(Module const& mod, OutputBlock &block, T& handler) {
    auto const count = handler.count();
    for (size_t i = 0; i < count; ++i) {
        block.begin(handler.id());
        handler.processOut(mod, block, i);
        block.finish();
    }
}